

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ProgramBinaryCase::test(ProgramBinaryCase *this)

{
  int program_00;
  GLuint shader;
  int *params;
  undefined1 local_28 [8];
  StateQueryMemoryWriteGuard<int> programLength;
  GLuint program;
  GLuint shaderFrag;
  GLuint shaderVert;
  ProgramBinaryCase *this_local;
  
  shader = glu::CallLogWrapper::glCreateShader(&(this->super_ApiCase).super_CallLogWrapper,0x8b31);
  programLength.m_postguard =
       glu::CallLogWrapper::glCreateShader(&(this->super_ApiCase).super_CallLogWrapper,0x8b30);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,shader,1,
             &Functional::(anonymous_namespace)::commonTestVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,programLength.m_postguard,1,
             &Functional::(anonymous_namespace)::commonTestFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(&(this->super_ApiCase).super_CallLogWrapper,shader);
  glu::CallLogWrapper::glCompileShader
            (&(this->super_ApiCase).super_CallLogWrapper,programLength.m_postguard);
  ApiCase::expectError(&this->super_ApiCase,0);
  programLength.m_value =
       glu::CallLogWrapper::glCreateProgram(&(this->super_ApiCase).super_CallLogWrapper);
  glu::CallLogWrapper::glAttachShader
            (&(this->super_ApiCase).super_CallLogWrapper,programLength.m_value,shader);
  glu::CallLogWrapper::glAttachShader
            (&(this->super_ApiCase).super_CallLogWrapper,programLength.m_value,
             programLength.m_postguard);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ApiCase).super_CallLogWrapper,programLength.m_value);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     &(this->super_ApiCase).super_CallLogWrapper,programLength.m_value,0x8257,0);
  glu::CallLogWrapper::glProgramParameteri
            (&(this->super_ApiCase).super_CallLogWrapper,programLength.m_value,0x8257,1);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ApiCase).super_CallLogWrapper,programLength.m_value);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     &(this->super_ApiCase).super_CallLogWrapper,programLength.m_value,0x8257,1);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_28);
  program_00 = programLength.m_value;
  params = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_28);
  glu::CallLogWrapper::glGetProgramiv
            (&(this->super_ApiCase).super_CallLogWrapper,program_00,0x8741,params);
  ApiCase::expectError(&this->super_ApiCase,0);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
            ((StateQueryMemoryWriteGuard<int> *)local_28,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,shader);
  glu::CallLogWrapper::glDeleteShader
            (&(this->super_ApiCase).super_CallLogWrapper,programLength.m_postguard);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ApiCase).super_CallLogWrapper,programLength.m_value);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &commonTestVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &commonTestFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);
		expectError(GL_NO_ERROR);

		// test PROGRAM_BINARY_RETRIEVABLE_HINT
		verifyProgramParam(m_testCtx, *this, program, GL_PROGRAM_BINARY_RETRIEVABLE_HINT, GL_FALSE);

		glProgramParameteri(program, GL_PROGRAM_BINARY_RETRIEVABLE_HINT, GL_TRUE);
		expectError(GL_NO_ERROR);

		glLinkProgram(program);
		expectError(GL_NO_ERROR);

		verifyProgramParam(m_testCtx, *this, program, GL_PROGRAM_BINARY_RETRIEVABLE_HINT, GL_TRUE);

		// test PROGRAM_BINARY_LENGTH does something

		StateQueryMemoryWriteGuard<GLint> programLength;
		glGetProgramiv(program, GL_PROGRAM_BINARY_LENGTH, &programLength);
		expectError(GL_NO_ERROR);
		programLength.verifyValidity(m_testCtx);

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}